

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# changesoplex.hpp
# Opt level: O0

void __thiscall
soplex::SPxSolverBase<double>::changeUpper
          (SPxSolverBase<double> *this,VectorBase<double> *newUpper,bool scale)

{
  SPxStatus SVar1;
  int iVar2;
  double *pdVar3;
  SPxSolverBase<double> *in_RDI;
  undefined1 unaff_retaddr;
  VectorBase<double> *in_stack_00000008;
  int i;
  uint i_00;
  uint local_18;
  
  forceRecompNonbasicValue(in_RDI);
  SPxLPBase<double>::changeUpper
            ((SPxLPBase<double> *)CONCAT17(scale,_i),in_stack_00000008,(bool)unaff_retaddr);
  SVar1 = SPxBasisBase<double>::status(&in_RDI->super_SPxBasisBase<double>);
  if (NO_PROBLEM < SVar1) {
    local_18 = 0;
    while( true ) {
      i_00 = local_18;
      iVar2 = VectorBase<double>::dim((VectorBase<double> *)0x207e3d);
      if (iVar2 <= (int)i_00) break;
      pdVar3 = SPxLPBase<double>::upper(&in_RDI->super_SPxLPBase<double>,i_00);
      (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x6a])
                (*pdVar3,0,in_RDI,(ulong)local_18);
      local_18 = local_18 + 1;
    }
    (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x77])();
  }
  return;
}

Assistant:

void SPxSolverBase<R>::changeUpper(const VectorBase<R>& newUpper, bool scale)
{
   // we better recompute the nonbasic value when changing all upper bounds
   forceRecompNonbasicValue();

   SPxLPBase<R>::changeUpper(newUpper, scale);

   if(SPxBasisBase<R>::status() > SPxBasisBase<R>::NO_PROBLEM)
   {
      for(int i = 0; i < newUpper.dim(); ++i)
         changeUpperStatus(i, this->upper(i));

      unInit();
   }
}